

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidget::event(QWidget *this,QEvent *event)

{
  undefined1 *puVar1;
  ushort uVar2;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar3;
  QWidget *pQVar4;
  QWExtra *pQVar5;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar6;
  long lVar7;
  QObject *pQVar8;
  char cVar9;
  undefined1 uVar10;
  quint16 qVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  QPalette *pQVar15;
  QWidget *pQVar16;
  long lVar17;
  long *plVar18;
  WId id;
  QStyle *pQVar19;
  QTLWExtra *pQVar20;
  QWindow *pQVar21;
  int i_1;
  char16_t *str1;
  ulong uVar22;
  char16_t *pcVar23;
  uint i_2;
  undefined8 uVar24;
  int i;
  long lVar25;
  int i_3;
  uint uVar26;
  QInputMethodQueryEvent *query;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  QPoint local_90;
  QStatusTipEvent tip;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar3 = this->data;
  uVar14 = pQVar3->widget_attributes;
  uVar2 = *(ushort *)(event + 8);
  if ((uVar14 & 1) != 0) {
    uVar10 = 0;
    if (((uVar2 - 2 < 6) ||
        ((uVar2 - 0x1f < 0x3f && ((0x6108000000000001U >> ((ulong)(uVar2 - 0x1f) & 0x3f) & 1) != 0))
        )) || ((uVar2 - 0xc2 < 0x10 && (uVar10 = 0, (0x8007U >> (uVar2 - 0xc2 & 0x1f) & 1) != 0))))
    goto switchD_002ff0a4_caseD_33;
  }
  uVar10 = 1;
  switch(uVar2) {
  case 2:
    (**(code **)(*(long *)this + 0x98))(this,event);
    break;
  case 3:
    (**(code **)(*(long *)this + 0xa0))(this,event);
    break;
  case 4:
    (**(code **)(*(long *)this + 0xa8))(this,event);
    break;
  case 5:
    (**(code **)(*(long *)this + 0xb0))(this,event);
    break;
  case 6:
    uVar22 = QKeyEvent::modifiers();
    if ((uVar22 & 0xc000000) == 0) {
      if (*(int *)(event + 0x40) == 0x1000002) {
LAB_002ffd0a:
        lVar17 = *(long *)this;
        uVar24 = 0;
      }
      else {
        if (*(int *)(event + 0x40) != 0x1000001) goto LAB_002ff6d7;
        uVar14 = QKeyEvent::modifiers();
        if ((uVar14 >> 0x19 & 1) != 0) goto LAB_002ffd0a;
        if (*(int *)(event + 0x40) != 0x1000001) goto LAB_002ff6d7;
        lVar17 = *(long *)this;
        uVar24 = 1;
      }
      cVar9 = (**(code **)(lVar17 + 0x198))(this,uVar24);
      if (cVar9 != '\0') break;
    }
LAB_002ff6d7:
    (**(code **)(*(long *)this + 0xc0))(this,event);
    if (((event[0xc] == (QEvent)0x0) && (uVar14 = QKeyEvent::modifiers(), (uVar14 >> 0x19 & 1) != 0)
        ) && ((*(int *)(event + 0x40) == 0x1000030 && ((this_00->whatsThis).d.size != 0)))) {
      (**(code **)(*(long *)this + 400))(&tip,this,2);
      auVar27 = ::QVariant::toRect();
      local_90 = (QPoint)(((long)auVar27._8_4_ + (long)auVar27._0_4_) / 2 & 0xffffffffU |
                         ((auVar27._8_8_ >> 0x20) + (auVar27._0_8_ >> 0x20)) / 2 << 0x20);
      local_58.d = (Data *)mapToGlobal(this,&local_90);
      QWhatsThis::showText((QPoint *)&local_58,&this_00->whatsThis,this);
      ::QVariant::~QVariant((QVariant *)&tip);
      event[0xc] = (QEvent)0x1;
    }
    break;
  case 7:
    (**(code **)(*(long *)this + 200))(this,event);
    break;
  case 8:
    (**(code **)(*(long *)this + 0xd0))(this,event);
    goto LAB_002ff9c0;
  case 9:
    (**(code **)(*(long *)this + 0xd8))(this,event);
    break;
  case 10:
    if ((this_00->statusTip).d.size != 0) {
      _tip = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&this_00->statusTip);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&tip);
      QStatusTipEvent::~QStatusTipEvent(&tip);
    }
    (**(code **)(*(long *)this + 0xe0))(this,event);
    break;
  case 0xb:
    if ((this_00->statusTip).d.size != 0) {
      local_58.size = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      _tip = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_58);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&tip);
      QStatusTipEvent::~QStatusTipEvent(&tip);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    (**(code **)(*(long *)this + 0xe8))(this,event);
    break;
  case 0xc:
    (**(code **)(*(long *)this + 0xf0))(this,event);
    break;
  case 0xd:
    (**(code **)(*(long *)this + 0xf8))(this,event);
    goto LAB_002ff9c0;
  case 0xe:
    (**(code **)(*(long *)this + 0x100))(this,event);
LAB_002ff9c0:
    QWidgetPrivate::updateWidgetTransform(this_00,event);
    break;
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x16:
  case 0x17:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x20:
  case 0x22:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4c:
  case 0x50:
  case 0x51:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x5b:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x6b:
  case 0x6c:
  case 0x70:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7c:
  case 0x7d:
  case 0x7e:
    goto switchD_002ff0a4_caseD_f;
  case 0x11:
    (**(code **)(*(long *)this + 0x148))(this,event);
    break;
  case 0x12:
    (**(code **)(*(long *)this + 0x150))(this,event);
    break;
  case 0x13:
    (**(code **)(*(long *)this + 0x108))(this,event);
    break;
  case 0x15:
  case 0x21:
  case 0x27:
  case 0x58:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6a:
  case 0x6d:
  case 0x78:
    goto switchD_002ff0a4_caseD_15;
  case 0x18:
  case 0x19:
    if ((short)uVar14 < 0) {
      pQVar15 = palette(this);
      cVar9 = QPalette::isEqual((ColorGroup)pQVar15,Active);
      if (cVar9 == '\0') {
        update(this);
      }
    }
    _tip = *(QPalettePrivate **)&this_00->field_0x18;
    lVar17 = *(long *)&this_00->field_0x20;
    lVar7 = *(long *)&this_00->field_0x28;
    if (_tip != (QPalettePrivate *)0x0) {
      LOCK();
      *(int *)_tip = *(int *)_tip + 1;
      UNLOCK();
    }
    for (lVar25 = 0; lVar7 != lVar25; lVar25 = lVar25 + 1) {
      pQVar8 = *(QObject **)(lVar17 + lVar25 * 8);
      if ((((pQVar8 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar8 + 8) + 0x30) & 1) != 0)) &&
          ((*(byte *)(*(long *)(pQVar8 + 0x20) + 9) & 0x80) != 0)) &&
         ((*(byte *)(*(long *)(pQVar8 + 0x20) + 0xc) & 1) == 0)) {
        QCoreApplication::sendEvent(pQVar8,event);
      }
    }
LAB_002ffbe7:
    QArrayDataPointer<QObject_*>::~QArrayDataPointer((QArrayDataPointer<QObject_*> *)&tip);
    break;
  case 0x1f:
    (**(code **)(*(long *)this + 0xb8))(this,event);
    break;
  case 0x23:
    if ((((pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->high_attributes[0] & 0x200000) == 0)) {
      QWidgetPrivate::setWindowIcon_sys(this_00);
      QWidgetPrivate::setWindowIcon_helper(this_00);
    }
    break;
  case 0x24:
    QWidgetPrivate::resolveFont(this_00);
    break;
  case 0x25:
    QWidgetPrivate::resolveLayoutDirection(this_00);
    break;
  case 0x26:
    if ((char)(pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
      QWidgetPrivate::resolvePalette(this_00);
    }
    break;
  case 0x33:
    break;
  case 0x3c:
    (**(code **)(*(long *)this + 0x128))(this,event);
    break;
  case 0x3d:
    (**(code **)(*(long *)this + 0x130))(this,event);
    break;
  case 0x3e:
    (**(code **)(*(long *)this + 0x138))(this,event);
    break;
  case 0x3f:
    (**(code **)(*(long *)this + 0x140))(this,event);
    break;
  case 0x49:
    if ((uVar14 >> 0x10 & 1) == 0) {
      QWidgetPrivate::show_sys(this_00);
    }
    break;
  case 0x4a:
    ensurePolished(this);
    break;
  case 0x4b:
    pQVar19 = style(this);
    (**(code **)(*(long *)pQVar19 + 0x60))(pQVar19,this);
    setAttribute(this,WA_WState_Polished,true);
    QApplication::font((QApplication *)&tip,this);
    QApplication::font();
    cVar9 = QFont::isCopyOf((QFont *)&tip);
    QFont::~QFont((QFont *)&local_58);
    QFont::~QFont((QFont *)&tip);
    if (cVar9 == '\0') {
      QWidgetPrivate::resolveFont(this_00);
    }
    QApplication::palette((QApplication *)&tip,this);
    QGuiApplication::palette();
    cVar9 = QPalette::isCopyOf((QPalette *)&tip);
    QPalette::~QPalette((QPalette *)&local_58);
    QPalette::~QPalette((QPalette *)&tip);
    if (cVar9 == '\0') {
      QWidgetPrivate::resolvePalette(this_00);
    }
LAB_002ff595:
    uVar10 = 1;
    break;
  case 0x4d:
    QWidgetPrivate::syncBackingStore(this_00);
    break;
  case 0x4e:
    update(this,(QRegion *)(event + 0x10));
    break;
  case 0x4f:
    pQVar20 = QWidgetPrivate::topData(this_00);
    (pQVar20->frameStrut).x1 = 0;
    (pQVar20->frameStrut).y1 = 0;
    (pQVar20->frameStrut).x2 = 0;
    (pQVar20->frameStrut).y2 = 0;
    puVar1 = &this->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffffefff;
    break;
  case 0x52:
    switch(*(uint *)&pQVar3->field_0x10 >> 0xd & 7) {
    case 1:
      (**(code **)(*(long *)this + 0x110))(this,event);
      break;
    case 2:
      if ((this_00->actions).d.size != 0) {
        QMenu::exec(&this_00->actions,(QPoint *)(event + 0x30),(QAction *)0x0,this);
        break;
      }
      goto switchD_002ff119_caseD_c2;
    case 3:
      customContextMenuRequested(this,(QPoint *)(event + 0x28));
      break;
    case 4:
      break;
    default:
      goto switchD_002ff119_caseD_c2;
    }
    break;
  case 0x53:
    (**(code **)(*(long *)this + 0x188))(this,event);
    break;
  case 0x57:
    if ((*(int *)(event + 0x44) == 0) && ((this_00->high_attributes[3] & 2) == 0)) break;
  case 0x5c:
  case 0x5d:
    (**(code **)(*(long *)this + 0x118))(this,event);
    break;
  case 0x59:
    (**(code **)(*(long *)this + 0x160))(this,event);
    _tip = *(QPalettePrivate **)&this_00->field_0x18;
    lVar17 = *(long *)&this_00->field_0x20;
    lVar7 = *(long *)&this_00->field_0x28;
    if (_tip != (QPalettePrivate *)0x0) {
      LOCK();
      *(int *)_tip = *(int *)_tip + 1;
      UNLOCK();
    }
    for (lVar25 = 0; lVar7 != lVar25; lVar25 = lVar25 + 1) {
      pQVar8 = *(QObject **)(lVar17 + lVar25 * 8);
      if (pQVar8 != (QObject *)0x0) {
        QCoreApplication::sendEvent(pQVar8,event);
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer((QArrayDataPointer<QObject_*> *)&tip);
  case 0x7f:
  case 0x80:
switchD_002ff0a4_caseD_7f:
    update(this);
    break;
  case 0x5a:
    if (this_00->layout != (QLayout *)0x0) {
      (**(code **)(*(long *)this_00->layout + 0x70))();
    }
    update(this);
    goto switchD_002ff0a4_caseD_15;
  case 0x67:
  case 0x68:
    if (*(long *)&this_00->field_0x28 != 0) {
      pQVar16 = QApplication::activeModalWidget();
      for (uVar22 = 0; uVar22 < *(ulong *)&this_00->field_0x28; uVar22 = uVar22 + 1) {
        pQVar4 = *(QWidget **)(*(long *)&this_00->field_0x20 + uVar22 * 8);
        if (((pQVar4 != pQVar16 && pQVar4 != (QWidget *)0x0) &&
            ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0)) &&
           (((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
          QCoreApplication::sendEvent(&pQVar4->super_QObject,event);
        }
      }
    }
    break;
  case 0x69:
    if (((byte)*(uint *)(event + 0x10) & 1) != (pQVar3->field_0x10 & 1)) {
      if ((*(uint *)(event + 0x10) & 1) == 0) {
        _tip = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)&tip);
        QCoreApplication::sendSpontaneousEvent(&this->super_QObject,(QEvent *)&tip);
        QWidgetPrivate::hideChildren(this_00,true);
        this_00->field_0x253 = this_00->field_0x253 | 0x20;
        QHideEvent::~QHideEvent((QHideEvent *)&tip);
        uVar14 = *(uint *)&this_00->field_0x250;
      }
      else {
        uVar14 = *(uint *)&this_00->field_0x250;
        if ((uVar14 >> 0x1e & 1) == 0) {
          QWidgetPrivate::showChildren(this_00,true);
          _tip = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)&tip);
          QCoreApplication::sendSpontaneousEvent(&this->super_QObject,(QEvent *)&tip);
          QShowEvent::~QShowEvent((QShowEvent *)&tip);
          uVar14 = *(uint *)&this_00->field_0x250;
        }
        uVar14 = uVar14 & 0xdfffffff;
      }
      *(uint *)&this_00->field_0x250 = uVar14 & 0xbfffffff;
    }
switchD_002ff0a4_caseD_15:
    (**(code **)(*(long *)this + 0x160))(this,event);
    break;
  case 0x6e:
    if ((this_00->toolTip).d.size != 0) {
      _tip = (QPalettePrivate *)0x0;
      QToolTip::showText((QPoint *)(event + 0x18),&this_00->toolTip,this,(QRect *)&tip,
                         this_00->toolTipDuration);
      break;
    }
    goto switchD_002ff119_caseD_c2;
  case 0x6f:
    if ((this_00->whatsThis).d.size != 0) {
      QWhatsThis::showText((QPoint *)(event + 0x18),&this_00->whatsThis,this);
      break;
    }
    goto switchD_002ff119_caseD_c2;
  case 0x71:
  case 0x72:
  case 0x73:
    (**(code **)(*(long *)this + 0x120))(this,event);
    break;
  case 0x7b:
    if ((this_00->whatsThis).d.size != 0) break;
switchD_002ff119_caseD_c2:
    event[0xc] = (QEvent)0x0;
    break;
  default:
    switch(uVar2) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc6:
    case 0xd1:
      goto switchD_002ff119_caseD_c2;
    case 0xcf:
      uVar14 = *(uint *)(event + 0x10);
      for (iVar12 = 0; iVar12 != 0x20; iVar12 = iVar12 + 1) {
        uVar26 = 1 << ((byte)iVar12 & 0x1f) & uVar14;
        if (uVar26 != 0) {
          _tip = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*(long *)this + 400))(&tip,this,uVar26);
          QInputMethodQueryEvent::setValue((InputMethodQuery)event,(QVariant *)(ulong)uVar26);
          ::QVariant::~QVariant((QVariant *)&tip);
        }
      }
      event[0xc] = (QEvent)0x1;
      goto LAB_002ff595;
    case 0xd2:
    case 0xdb:
      goto switchD_002ff0a4_caseD_15;
    case 0xd5:
      if ((-1 < (short)uVar14) || (pQVar16 = window(this), (pQVar16->data->field_0x10 & 1) != 0))
      break;
      event[0xc] = (QEvent)0x1;
      goto switchD_002ff0a4_caseD_7f;
    case 0xd8:
      pQVar5 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((pQVar5 != (QWExtra *)0x0) &&
         (tVar6.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
                &(pQVar5->topextra)._M_t.
                 super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
         tVar6.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl !=
         (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) {
        if ((*(long *)((long)tVar6.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) == 0) ||
           (lVar17 = QWindow::handle(), lVar17 == 0)) {
          id = 0;
        }
        else {
          plVar18 = (long *)QWindow::handle();
          id = (**(code **)(*plVar18 + 0x68))(plVar18);
        }
        QWidgetPrivate::setWinId(this_00,id);
      }
      break;
    case 0xd9:
      if (*(int *)(event + 0x10) == 1) {
        if ((this_00->high_attributes[0] & 0x10000000) != 0) {
          destroy(this,false,false);
        }
      }
      else if ((*(int *)(event + 0x10) == 0) && ((this_00->high_attributes[0] & 0x10000000) == 0)) {
        create(this,0,false,false);
      }
      break;
    case 0xde:
      iVar12 = *(int *)(*(long *)&(this_00->data).fnt + 0x78);
      iVar13 = (**(code **)(*(long *)&this->super_QPaintDevice + 0x20))(&this->super_QPaintDevice,8)
      ;
      if (iVar12 != iVar13) {
        QWidgetPrivate::updateFont(this_00,&(this_00->data).fnt);
      }
      this_00->field_0x253 = this_00->field_0x253 | 8;
      break;
    default:
      if (uVar2 - 0xb1 < 2) goto switchD_002ff0a4_caseD_15;
      if (uVar2 == 0xa9) {
        (**(code **)(*(long *)this + 0x160))(this,event);
        _tip = *(QPalettePrivate **)&this_00->field_0x18;
        lVar17 = *(long *)&this_00->field_0x20;
        lVar7 = *(long *)&this_00->field_0x28;
        if (_tip != (QPalettePrivate *)0x0) {
          LOCK();
          *(int *)_tip = *(int *)_tip + 1;
          UNLOCK();
        }
        for (lVar25 = 0; lVar7 != lVar25; lVar25 = lVar25 + 1) {
          pQVar8 = *(QObject **)(lVar17 + lVar25 * 8);
          if ((((pQVar8 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar8 + 8) + 0x30) & 1) != 0))
              && ((*(byte *)(*(long *)(pQVar8 + 0x20) + 9) & 0x80) != 0)) &&
             ((*(byte *)(*(long *)(pQVar8 + 0x20) + 0xc) & 1) == 0)) {
            QCoreApplication::sendEvent(pQVar8,event);
          }
        }
        goto LAB_002ffbe7;
      }
      if (uVar2 == 0xaa) {
        local_58.d = *(Data **)(event + 0x10);
        pcVar23 = *(char16_t **)(event + 0x18);
        local_58.size = *(qsizetype *)(event + 0x20);
        if ((QPoint)local_58.d != (QPoint)0x0) {
          LOCK();
          *(int *)local_58.d = *(int *)local_58.d + 1;
          UNLOCK();
        }
        local_58.ptr = pcVar23;
        if (local_58.size == 0xd) {
          str1 = pcVar23;
          if (pcVar23 == (char16_t *)0x0) {
            str1 = (char16_t *)&QByteArray::_empty;
          }
          iVar12 = qstrncmp((char *)str1,"_q_customDpi",0xc);
          if (iVar12 == 0) {
            QObject::property((char *)&tip);
            qVar11 = ::QVariant::toUInt((bool *)&tip);
            ::QVariant::~QVariant((QVariant *)&tip);
            if ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
              QWidgetPrivate::createExtra(this_00);
            }
            if ((char)pcVar23[6] == 'Y') {
              ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->customDpiY = qVar11;
            }
            else if ((char)pcVar23[6] == 'X') {
              ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->customDpiX = qVar11;
            }
            QWidgetPrivate::updateFont(this_00,&(this_00->data).fnt);
          }
        }
        pQVar21 = windowHandle(this);
        if (pQVar21 != (QWindow *)0x0) {
          pcVar23 = local_58.ptr;
          if (local_58.ptr == (char16_t *)0x0) {
            pcVar23 = (char16_t *)&QByteArray::_empty;
          }
          iVar12 = qstrncmp((char *)pcVar23,"_q_platform_",0xc);
          if (iVar12 == 0) {
            pQVar21 = windowHandle(this);
            QObject::property((char *)&tip);
            QObject::setProperty((QObject *)pQVar21,(char *)pcVar23,(QVariant *)&tip);
            ::QVariant::~QVariant((QVariant *)&tip);
          }
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      }
    case 0xc5:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xd0:
    case 0xd3:
    case 0xd4:
    case 0xd6:
    case 0xd7:
    case 0xda:
    case 0xdc:
    case 0xdd:
switchD_002ff0a4_caseD_f:
      uVar10 = QObject::event((QEvent *)this);
    }
  }
switchD_002ff0a4_caseD_33:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidget::event(QEvent *event)
{
    Q_D(QWidget);

    // ignore mouse and key events when disabled
    if (!isEnabled()) {
        switch(event->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::TouchBegin:
        case QEvent::TouchUpdate:
        case QEvent::TouchEnd:
        case QEvent::TouchCancel:
        case QEvent::ContextMenu:
        case QEvent::KeyPress:
        case QEvent::KeyRelease:
#if QT_CONFIG(wheelevent)
        case QEvent::Wheel:
#endif
            return false;
        default:
            break;
        }
    }
    switch (event->type()) {
    case QEvent::PlatformSurface: {
        // Sync up QWidget's view of whether or not the widget has been created
        switch (static_cast<QPlatformSurfaceEvent*>(event)->surfaceEventType()) {
        case QPlatformSurfaceEvent::SurfaceCreated:
            if (!testAttribute(Qt::WA_WState_Created))
                create();
            break;
        case QPlatformSurfaceEvent::SurfaceAboutToBeDestroyed:
            if (testAttribute(Qt::WA_WState_Created)) {
                // Child windows have already been destroyed by QWindow,
                // so we skip them here.
                destroy(false, false);
            }
            break;
        }
        break;
    }
    case QEvent::MouseMove:
        mouseMoveEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonPress:
        mousePressEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonRelease:
        mouseReleaseEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonDblClick:
        mouseDoubleClickEvent((QMouseEvent*)event);
        break;
#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        wheelEvent((QWheelEvent*)event);
        break;
#endif
#if QT_CONFIG(tabletevent)
    case QEvent::TabletMove:
        if (static_cast<QTabletEvent *>(event)->buttons() == Qt::NoButton && !testAttribute(Qt::WA_TabletTracking))
            break;
        Q_FALLTHROUGH();
    case QEvent::TabletPress:
    case QEvent::TabletRelease:
        tabletEvent((QTabletEvent*)event);
        break;
#endif
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        bool res = false;
        if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
            if (k->key() == Qt::Key_Backtab
                || (k->key() == Qt::Key_Tab && (k->modifiers() & Qt::ShiftModifier)))
                res = focusNextPrevChild(false);
            else if (k->key() == Qt::Key_Tab)
                res = focusNextPrevChild(true);
            if (res)
                break;
        }
        keyPressEvent(k);
#ifdef QT_KEYPAD_NAVIGATION
        if (!k->isAccepted() && QApplication::keypadNavigationEnabled()
            && !(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier | Qt::ShiftModifier))) {
            if (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder) {
                if (k->key() == Qt::Key_Up)
                    res = focusNextPrevChild(false);
                else if (k->key() == Qt::Key_Down)
                    res = focusNextPrevChild(true);
            } else if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                if (k->key() == Qt::Key_Up)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionNorth);
                else if (k->key() == Qt::Key_Right)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionEast);
                else if (k->key() == Qt::Key_Down)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionSouth);
                else if (k->key() == Qt::Key_Left)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionWest);
            }
            if (res) {
                k->accept();
                break;
            }
        }
#endif
#if QT_CONFIG(whatsthis)
        if (!k->isAccepted()
            && k->modifiers() & Qt::ShiftModifier && k->key() == Qt::Key_F1
            && d->whatsThis.size()) {
            QWhatsThis::showText(mapToGlobal(inputMethodQuery(Qt::ImCursorRectangle).toRect().center()), d->whatsThis, this);
            k->accept();
        }
#endif
    }
        break;

    case QEvent::KeyRelease:
        keyReleaseEvent((QKeyEvent*)event);
        Q_FALLTHROUGH();
    case QEvent::ShortcutOverride:
        break;

    case QEvent::InputMethod:
        inputMethodEvent((QInputMethodEvent *) event);
        break;

    case QEvent::InputMethodQuery: {
            QInputMethodQueryEvent *query = static_cast<QInputMethodQueryEvent *>(event);
            Qt::InputMethodQueries queries = query->queries();
            for (uint i = 0; i < 32; ++i) {
                Qt::InputMethodQuery q = (Qt::InputMethodQuery)(int)(queries & (1<<i));
                if (q) {
                    QVariant v = inputMethodQuery(q);
                    if (q == Qt::ImEnabled && !v.isValid() && isEnabled()) {
                        // Qt:ImEnabled was added in Qt 5.3. So not all widgets support it, even
                        // if they implement IM otherwise (by overriding inputMethodQuery()). Instead
                        // they set the widget attribute Qt::WA_InputMethodEnabled. But this attribute
                        // will only be set if the widget supports IM _and_ is not read-only. So for
                        // read-only widgets, not all IM features will be supported when ImEnabled is
                        // not implemented explicitly (e.g selection handles for read-only widgets on iOS).
                        v = QVariant(testAttribute(Qt::WA_InputMethodEnabled));
                    }
                    query->setValue(q, v);
                }
            }
            query->accept();
        }
        break;

    case QEvent::PolishRequest:
        ensurePolished();
        break;

    case QEvent::Polish: {
        style()->polish(this);
        setAttribute(Qt::WA_WState_Polished);
        if (!QApplication::font(this).isCopyOf(QApplication::font()))
            d->resolveFont();
        if (!QApplication::palette(this).isCopyOf(QGuiApplication::palette()))
            d->resolvePalette();
    }
        break;

    case QEvent::ApplicationWindowIconChange:
        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon)) {
            d->setWindowIcon_sys();
            d->setWindowIcon_helper();
        }
        break;
    case QEvent::FocusIn:
        focusInEvent((QFocusEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::FocusOut:
        focusOutEvent((QFocusEvent*)event);
        break;

    case QEvent::Enter:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QStatusTipEvent tip(d->statusTip);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        enterEvent(static_cast<QEnterEvent*>(event));
        break;

    case QEvent::Leave:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        leaveEvent(event);
        break;

    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        update();
        break;

    case QEvent::Paint:
        // At this point the event has to be delivered, regardless
        // whether the widget isVisible() or not because it
        // already went through the filters
        paintEvent((QPaintEvent*)event);
        break;

    case QEvent::Move:
        moveEvent((QMoveEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Resize:
        resizeEvent((QResizeEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Close:
        closeEvent((QCloseEvent *)event);
        break;

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        switch (data->context_menu_policy) {
        case Qt::PreventContextMenu:
            break;
        case Qt::DefaultContextMenu:
            contextMenuEvent(static_cast<QContextMenuEvent *>(event));
            break;
        case Qt::CustomContextMenu:
            emit customContextMenuRequested(static_cast<QContextMenuEvent *>(event)->pos());
            break;
#if QT_CONFIG(menu)
        case Qt::ActionsContextMenu:
            if (d->actions.size()) {
                QMenu::exec(d->actions, static_cast<QContextMenuEvent *>(event)->globalPos(),
                            nullptr, this);
                break;
            }
            Q_FALLTHROUGH();
#endif
        default:
            event->ignore();
            break;
        }
        break;
#endif // QT_NO_CONTEXTMENU

#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
        dropEvent((QDropEvent*) event);
        break;

    case QEvent::DragEnter:
        dragEnterEvent((QDragEnterEvent*) event);
        break;

    case QEvent::DragMove:
        dragMoveEvent((QDragMoveEvent*) event);
        break;

    case QEvent::DragLeave:
        dragLeaveEvent((QDragLeaveEvent*) event);
        break;
#endif

    case QEvent::Show:
        showEvent((QShowEvent*) event);
        break;

    case QEvent::Hide:
        hideEvent((QHideEvent*) event);
        break;

    case QEvent::ShowWindowRequest:
        if (!isHidden())
            d->show_sys();
        break;

    case QEvent::ApplicationFontChange:
        d->resolveFont();
        break;
    case QEvent::ApplicationPaletteChange:
        if (!(windowType() == Qt::Desktop))
            d->resolvePalette();
        break;

    case QEvent::ToolBarChange:
    case QEvent::ActivationChange:
    case QEvent::EnabledChange:
    case QEvent::FontChange:
    case QEvent::StyleChange:
    case QEvent::PaletteChange:
    case QEvent::WindowTitleChange:
    case QEvent::IconTextChange:
    case QEvent::ModifiedChange:
    case QEvent::MouseTrackingChange:
    case QEvent::TabletTrackingChange:
    case QEvent::ParentChange:
    case QEvent::LocaleChange:
    case QEvent::MacSizeChange:
    case QEvent::ContentsRectChange:
    case QEvent::ThemeChange:
    case QEvent::ReadOnlyChange:
        changeEvent(event);
        break;

    case QEvent::WindowStateChange: {
        const bool wasMinimized = static_cast<const QWindowStateChangeEvent *>(event)->oldState() & Qt::WindowMinimized;
        if (wasMinimized != isMinimized()) {
            QWidget *widget = const_cast<QWidget *>(this);
            if (wasMinimized) {
                // Always send the spontaneous events here, otherwise it can break the application!
                if (!d->childrenShownByExpose) {
                    // Show widgets only when they are not yet shown by the expose event
                    d->showChildren(true);
                    QShowEvent showEvent;
                    QCoreApplication::sendSpontaneousEvent(widget, &showEvent);
                }
                d->childrenHiddenByWState = false; // Set it always to "false" when window is restored
            } else {
                QHideEvent hideEvent;
                QCoreApplication::sendSpontaneousEvent(widget, &hideEvent);
                d->hideChildren(true);
                d->childrenHiddenByWState = true;
            }
            d->childrenShownByExpose = false; // Set it always to "false" when window state changes
        }
        changeEvent(event);
    }
        break;

    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate: {
        if (isVisible() && !palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        QList<QObject*> childList = d->children;
        for (int i = 0; i < childList.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(childList.at(i));
            if (w && w->isVisible() && !w->isWindow())
                QCoreApplication::sendEvent(w, event);
        }
        break; }

    case QEvent::LanguageChange:
        changeEvent(event);
        {
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QObject *o = childList.at(i);
                if (o)
                    QCoreApplication::sendEvent(o, event);
            }
        }
        update();
        break;

    case QEvent::ApplicationLayoutDirectionChange:
        d->resolveLayoutDirection();
        break;

    case QEvent::LayoutDirectionChange:
        if (d->layout)
            d->layout->invalidate();
        update();
        changeEvent(event);
        break;
    case QEvent::UpdateRequest:
        d->syncBackingStore();
        break;
    case QEvent::UpdateLater:
        update(static_cast<QUpdateLaterEvent*>(event)->region());
        break;
    case QEvent::StyleAnimationUpdate:
        if (isVisible() && !window()->isMinimized()) {
            event->accept();
            update();
        }
        break;

    case QEvent::WindowBlocked:
    case QEvent::WindowUnblocked:
        if (!d->children.isEmpty()) {
            QWidget *modalWidget = QApplication::activeModalWidget();
            for (int i = 0; i < d->children.size(); ++i) {
                QObject *o = d->children.at(i);
                if (o && o != modalWidget && o->isWidgetType()) {
                    QWidget *w  = static_cast<QWidget *>(o);
                    // do not forward the event to child windows; QApplication does this for us
                    if (!w->isWindow())
                        QCoreApplication::sendEvent(w, event);
                }
            }
        }
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (!d->toolTip.isEmpty())
            QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), d->toolTip, this, QRect(), d->toolTipDuration);
        else
            event->ignore();
        break;
#endif
#if QT_CONFIG(whatsthis)
    case QEvent::WhatsThis:
        if (d->whatsThis.size())
            QWhatsThis::showText(static_cast<QHelpEvent *>(event)->globalPos(), d->whatsThis, this);
        else
            event->ignore();
        break;
    case QEvent::QueryWhatsThis:
        if (d->whatsThis.isEmpty())
            event->ignore();
        break;
#endif
    case QEvent::EmbeddingControl:
        d->topData()->frameStrut.setCoords(0 ,0, 0, 0);
        data->fstrut_dirty = false;
        break;
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionRemoved:
    case QEvent::ActionChanged:
        actionEvent((QActionEvent*)event);
        break;
#endif

    case QEvent::KeyboardLayoutChange:
        {
            changeEvent(event);

            // inform children of the change
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QWidget *w = qobject_cast<QWidget *>(childList.at(i));
                if (w && w->isVisible() && !w->isWindow())
                    QCoreApplication::sendEvent(w, event);
            }
            break;
        }
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
    {
        event->ignore();
        break;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        event->ignore();
        break;
#endif
    case QEvent::ScreenChangeInternal:
        if (const QTLWExtra *te = d->maybeTopData()) {
            const QWindow *win = te->window;
            d->setWinId((win && win->handle()) ? win->handle()->winId() : 0);
        }
        break;
    case QEvent::DevicePixelRatioChange:
        if (d->data.fnt.d->dpi != logicalDpiY())
            d->updateFont(d->data.fnt);
        d->renderToTextureReallyDirty = 1;
        break;
    case QEvent::DynamicPropertyChange: {
        const QByteArray &propName = static_cast<QDynamicPropertyChangeEvent *>(event)->propertyName();
        if (propName.size() == 13 && !qstrncmp(propName, "_q_customDpi", 12)) {
            uint value = property(propName.constData()).toUInt();
            if (!d->extra)
                d->createExtra();
            const char axis = propName.at(12);
            if (axis == 'X')
                d->extra->customDpiX = value;
            else if (axis == 'Y')
                d->extra->customDpiY = value;
            d->updateFont(d->data.fnt);
        }
        if (windowHandle() && !qstrncmp(propName, "_q_platform_", 12))
            windowHandle()->setProperty(propName, property(propName));
        Q_FALLTHROUGH();
    }
    default:
        return QObject::event(event);
    }
    return true;
}